

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O1

int KINBBDPrecInit(void *kinmem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dq_rel_uu,KINBBDLocalFn gloc,
                  KINBBDCommFn gcomm)

{
  double __x;
  long lVar1;
  int iVar2;
  long *__ptr;
  SUNMatrix p_Var3;
  N_Vector p_Var4;
  long lVar5;
  SUNLinearSolver p_Var6;
  long smu;
  int iVar7;
  int error_code;
  char *msgfmt;
  sunrealtype sVar8;
  sunindextype lrw1;
  long liw;
  long lrw;
  long local_58;
  long local_50;
  sunrealtype local_48;
  long local_40;
  long local_38;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL Memory is NULL.";
    iVar7 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    iVar2 = 0x48;
  }
  else {
    lVar1 = *(long *)((long)kinmem + 600);
    if (lVar1 == 0) {
      msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
      iVar7 = -2;
      error_code = -2;
      iVar2 = 0x51;
    }
    else if (*(long *)(*(long *)(*(long *)((long)kinmem + 0x148) + 8) + 0x28) == 0) {
      msgfmt = "A required vector operation is not implemented.";
      iVar7 = -3;
      error_code = -3;
      iVar2 = 0x5b;
    }
    else {
      local_48 = dq_rel_uu;
      __ptr = (long *)malloc(0x98);
      if (__ptr == (long *)0x0) {
        msgfmt = "A memory request failed.";
        iVar7 = -4;
        error_code = -4;
        iVar2 = 0x65;
      }
      else {
        lVar5 = 0;
        if (mudq < 1) {
          mudq = lVar5;
        }
        smu = Nlocal + -1;
        if (Nlocal <= mudq) {
          mudq = smu;
        }
        __ptr[0x12] = (long)kinmem;
        if (mldq < 1) {
          mldq = lVar5;
        }
        __ptr[5] = (long)gloc;
        if (Nlocal <= mldq) {
          mldq = smu;
        }
        if (mukeep < 1) {
          mukeep = lVar5;
        }
        __ptr[6] = (long)gcomm;
        if (Nlocal <= mukeep) {
          mukeep = smu;
        }
        *__ptr = mudq;
        if (mlkeep < 1) {
          mlkeep = lVar5;
        }
        __ptr[1] = mldq;
        if (Nlocal <= mlkeep) {
          mlkeep = smu;
        }
        __ptr[2] = mukeep;
        __ptr[3] = mlkeep;
        if (mlkeep + mukeep < Nlocal) {
          smu = mlkeep + mukeep;
        }
        __ptr[8] = 0;
        p_Var3 = SUNBandMatrixStorage(Nlocal,mukeep,mlkeep,smu,*kinmem);
        __ptr[8] = (long)p_Var3;
        if (p_Var3 == (SUNMatrix)0x0) {
          free(__ptr);
          msgfmt = "A memory request failed.";
          iVar7 = -4;
          error_code = -4;
          iVar2 = 0x80;
        }
        else {
          __ptr[0xb] = 0;
          p_Var4 = N_VNew_Serial(Nlocal,*kinmem);
          __ptr[0xb] = (long)p_Var4;
          if (p_Var4 == (N_Vector)0x0) {
            SUNMatDestroy(__ptr[8]);
            free(__ptr);
            msgfmt = "A memory request failed.";
            iVar7 = -4;
            error_code = -4;
            iVar2 = 0x8d;
          }
          else {
            __ptr[10] = 0;
            p_Var4 = N_VNewEmpty_Serial(Nlocal,*kinmem);
            __ptr[10] = (long)p_Var4;
            if (p_Var4 == (N_Vector)0x0) {
              N_VDestroy(__ptr[0xb]);
              SUNMatDestroy(__ptr[8]);
              free(__ptr);
              msgfmt = "A memory request failed.";
              iVar7 = -4;
              error_code = -4;
              iVar2 = 0x9a;
            }
            else {
              __ptr[0xc] = 0;
              lVar5 = N_VClone(*(undefined8 *)((long)kinmem + 0x148));
              __ptr[0xc] = lVar5;
              if (lVar5 == 0) {
                N_VDestroy(__ptr[0xb]);
                N_VDestroy(__ptr[10]);
                SUNMatDestroy(__ptr[8]);
                free(__ptr);
                msgfmt = "A memory request failed.";
                iVar7 = -4;
                error_code = -4;
                iVar2 = 0xa8;
              }
              else {
                __ptr[0xd] = 0;
                lVar5 = N_VClone(*(undefined8 *)((long)kinmem + 0x148));
                __ptr[0xd] = lVar5;
                if (lVar5 == 0) {
                  N_VDestroy(__ptr[0xb]);
                  N_VDestroy(__ptr[10]);
                  N_VDestroy(__ptr[0xc]);
                  SUNMatDestroy(__ptr[8]);
                  free(__ptr);
                  msgfmt = "A memory request failed.";
                  iVar7 = -4;
                  error_code = -4;
                  iVar2 = 0xb7;
                }
                else {
                  __ptr[0xe] = 0;
                  lVar5 = N_VClone(*(undefined8 *)((long)kinmem + 0x148));
                  __ptr[0xe] = lVar5;
                  if (lVar5 == 0) {
                    N_VDestroy(__ptr[0xb]);
                    N_VDestroy(__ptr[10]);
                    N_VDestroy(__ptr[0xc]);
                    N_VDestroy(__ptr[0xd]);
                    SUNMatDestroy(__ptr[8]);
                    free(__ptr);
                    msgfmt = "A memory request failed.";
                    iVar7 = -4;
                    error_code = -4;
                    iVar2 = 199;
                  }
                  else {
                    __ptr[9] = 0;
                    p_Var6 = SUNLinSol_Band((N_Vector)__ptr[0xb],(SUNMatrix)__ptr[8],*kinmem);
                    __ptr[9] = (long)p_Var6;
                    if (p_Var6 == (SUNLinearSolver)0x0) {
                      N_VDestroy(__ptr[0xb]);
                      N_VDestroy(__ptr[10]);
                      N_VDestroy(__ptr[0xc]);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      free(__ptr);
                      msgfmt = "A memory request failed.";
                      iVar7 = -4;
                      error_code = -4;
                      iVar2 = 0xd9;
                    }
                    else {
                      iVar2 = SUNLinSolInitialize(p_Var6);
                      if (iVar2 == 0) {
                        sVar8 = local_48;
                        if (local_48 <= 0.0) {
                          __x = *(double *)((long)kinmem + 8);
                          sVar8 = 0.0;
                          if (0.0 < __x) {
                            if (__x < 0.0) {
                              sVar8 = sqrt(__x);
                            }
                            else {
                              sVar8 = SQRT(__x);
                            }
                          }
                        }
                        __ptr[4] = (long)sVar8;
                        __ptr[7] = Nlocal;
                        __ptr[0xf] = 0;
                        __ptr[0x10] = 0;
                        if (*(long *)(*(long *)(*(long *)((long)kinmem + 0x148) + 8) + 0x20) != 0) {
                          N_VSpace(*(long *)((long)kinmem + 0x148),&local_50,&local_58);
                          __ptr[0xf] = __ptr[0xf] + local_50 * 3;
                          __ptr[0x10] = __ptr[0x10] + local_58 * 3;
                        }
                        if (*(long *)(*(long *)(__ptr[0xb] + 8) + 0x20) != 0) {
                          N_VSpace(__ptr[0xb],&local_50,&local_58);
                          __ptr[0xf] = __ptr[0xf] + local_50;
                          __ptr[0x10] = __ptr[0x10] + local_58;
                        }
                        if (*(long *)(*(long *)(__ptr[10] + 8) + 0x20) != 0) {
                          N_VSpace(__ptr[10],&local_50,&local_58);
                          __ptr[0xf] = __ptr[0xf] + local_50;
                          __ptr[0x10] = __ptr[0x10] + local_58;
                        }
                        if (*(long *)(*(long *)(__ptr[8] + 8) + 0x50) != 0) {
                          SUNMatSpace(__ptr[8],&local_38,&local_40);
                          __ptr[0xf] = __ptr[0xf] + local_38;
                          __ptr[0x10] = __ptr[0x10] + local_40;
                        }
                        if (*(long *)(*(long *)(__ptr[9] + 8) + 0x60) != 0) {
                          SUNLinSolSpace(__ptr[9],&local_38,&local_40);
                          __ptr[0xf] = __ptr[0xf] + local_38;
                          __ptr[0x10] = __ptr[0x10] + local_40;
                        }
                        __ptr[0x11] = 0;
                        if (*(code **)(lVar1 + 0x88) != (code *)0x0) {
                          (**(code **)(lVar1 + 0x88))(kinmem);
                        }
                        *(long **)(lVar1 + 0x90) = __ptr;
                        *(code **)(lVar1 + 0x88) = KINBBDPrecFree;
                        iVar2 = KINSetPreconditioner(kinmem,KINBBDPrecSetup,KINBBDPrecSolve);
                        return iVar2;
                      }
                      N_VDestroy(__ptr[0xb]);
                      N_VDestroy(__ptr[10]);
                      N_VDestroy(__ptr[0xc]);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      SUNLinSolFree(__ptr[9]);
                      free(__ptr);
                      msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                      iVar7 = -8;
                      error_code = -8;
                      iVar2 = 0xeb;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  KINProcessError((KINMem)kinmem,error_code,iVar2,"KINBBDPrecInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                  ,msgfmt);
  return iVar7;
}

Assistant:

int KINBBDPrecInit(void* kinmem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dq_rel_uu, KINBBDLocalFn gloc, KINBBDCommFn gcomm)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  /* Test if the LS linear solver interface has been created */
  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  /* Note: Do NOT need to check for N_VScale since has already been checked for in KINSOL */
  if (kin_mem->kin_vtemp1->ops->nvgetarraypointer == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGBBD_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (KBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Set pointers to gloc and gcomm; load half-bandwidths */
  pdata->kin_mem = kinmem;
  pdata->gloc    = gloc;
  pdata->gcomm   = gcomm;
  pdata->mudq    = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq    = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk            = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk            = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep  = muk;
  pdata->mlkeep  = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting) */
  storage_mu = SUNMIN(Nlocal - 1, muk + mlk);

  /* Allocate memory for preconditioner matrix */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                   kin_mem->kin_sunctx);
  if (pdata->PP == NULL)
  {
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNew_Serial(Nlocal, kin_mem->kin_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, kin_mem->kin_sunctx); /* empty vector */
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv1 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv2 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv3 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->zlocal, pdata->PP, kin_mem->kin_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNLS_FAIL);
    return (KINLS_SUNLS_FAIL);
  }

  /* Set rel_uu based on input value dq_rel_uu (0 implies default) */
  pdata->rel_uu = (dq_rel_uu > ZERO) ? dq_rel_uu : SUNRsqrt(kin_mem->kin_uround);

  /* Store Nlocal to be used in KINBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (kin_mem->kin_vtemp1->ops->nvspace)
  {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->zlocal->ops->nvspace)
  {
    N_VSpace(pdata->zlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->PP->ops->space)
  {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (kinls_mem->pfree != NULL) { kinls_mem->pfree(kin_mem); }

  /* Point to the new pdata field in the LS memory */
  kinls_mem->pdata = pdata;

  /* Attach the pfree function */
  kinls_mem->pfree = KINBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = KINSetPreconditioner(kinmem, KINBBDPrecSetup, KINBBDPrecSolve);

  return (flag);
}